

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O2

void __thiscall
gl4cts::KHRDebug::ReceiveingMessagesTest::inspectDebugState
          (ReceiveingMessagesTest *this,GLboolean expected_state,GLDEBUGPROC expected_callback,
          GLvoid *expected_user_info)

{
  GLenum GVar1;
  TestError *this_00;
  GLboolean debug_state;
  GLvoid *callback_user_info;
  GLvoid *callback_procedure;
  ostringstream local_1a0 [376];
  
  debug_state = 0xff;
  (*((this->super_TestBase).m_gl)->getBooleanv)(0x92e0,&debug_state);
  GVar1 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar1,"GetBooleanv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x710);
  if (debug_state == expected_state) {
    callback_procedure = (GLvoid *)0x0;
    (*((this->super_TestBase).m_gl)->getPointerv)(0x8244,&callback_procedure);
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"GetPointerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x71c);
    if ((GLDEBUGPROC)callback_procedure == expected_callback) {
      callback_user_info = (GLvoid *)0x0;
      (*((this->super_TestBase).m_gl)->getPointerv)(0x8245,&callback_user_info);
      GVar1 = (*((this->super_TestBase).m_gl)->getError)();
      glu::checkError(GVar1,"GetPointerv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                      ,0x725);
      if (callback_user_info == expected_user_info) {
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid state of DEBUG_CALLBACK_USER_PARAM",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x729);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid state of DEBUG_CALLBACK_FUNCTION",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x720);
    }
  }
  else {
    callback_procedure = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,"State of DEBUG_OUTPUT: ");
    std::operator<<((ostream *)local_1a0,debug_state);
    std::operator<<((ostream *)local_1a0,", expected ");
    std::operator<<((ostream *)local_1a0,expected_state);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&callback_procedure,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid state of DEBUG_OUTPUT",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x717);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ReceiveingMessagesTest::inspectDebugState(GLboolean expected_state, GLDEBUGPROC expected_callback,
											   GLvoid* expected_user_info) const
{
	GLboolean debug_state = -1;
	m_gl->getBooleanv(GL_DEBUG_OUTPUT, &debug_state);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetBooleanv");

	if (expected_state != debug_state)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "State of DEBUG_OUTPUT: " << debug_state
											<< ", expected " << expected_state << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid state of DEBUG_OUTPUT");
	}

	GLvoid* callback_procedure = 0;
	m_gl->getPointerv(GL_DEBUG_CALLBACK_FUNCTION, &callback_procedure);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetPointerv");

	if (expected_callback != callback_procedure)
	{
		TCU_FAIL("Invalid state of DEBUG_CALLBACK_FUNCTION");
	}

	GLvoid* callback_user_info = 0;
	m_gl->getPointerv(GL_DEBUG_CALLBACK_USER_PARAM, &callback_user_info);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetPointerv");

	if (expected_user_info != callback_user_info)
	{
		TCU_FAIL("Invalid state of DEBUG_CALLBACK_USER_PARAM");
	}
}